

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O0

int xsdTestCase(xmlNodePtr tst)

{
  FILE *pFVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  xmlNodePtr pxVar6;
  xmlNodePtr pxVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  xmlChar *dtd;
  int memt;
  int mem;
  int ret;
  xmlRelaxNGPtr rng;
  xmlRelaxNGValidCtxtPtr ctxt;
  xmlRelaxNGParserCtxtPtr pctxt;
  xmlDocPtr doc;
  xmlBufferPtr buf;
  xmlNodePtr cur;
  xmlNodePtr tmp;
  xmlNodePtr test;
  xmlNodePtr tst_local;
  
  memt = 0;
  resetEntities();
  testErrorsSize = 0;
  testErrors[0] = '\0';
  pxVar6 = getNext(tst,"./dir[1]");
  if (pxVar6 != (xmlNodePtr)0x0) {
    installDirs(pxVar6,(xmlChar *)0x0);
  }
  pxVar6 = getNext(tst,"./resource[1]");
  if (pxVar6 != (xmlNodePtr)0x0) {
    installResources(pxVar6,(xmlChar *)0x0);
  }
  pxVar6 = getNext(tst,"./correct[1]");
  if (pxVar6 == (xmlNodePtr)0x0) {
    tst_local._4_4_ = xsdIncorrectTestCase(tst);
  }
  else {
    pxVar7 = getNext(pxVar6,"./*");
    pFVar1 = _stderr;
    if (pxVar7 == (xmlNodePtr)0x0) {
      uVar8 = xmlGetLineNo(pxVar6);
      fprintf(pFVar1,"Failed to find test in correct line %ld\n",uVar8);
      tst_local._4_4_ = 1;
    }
    else {
      iVar2 = xmlMemUsed();
      lVar9 = xmlBufferCreate();
      if (lVar9 == 0) {
        fprintf(_stderr,"out of memory !\n");
        fatalError();
      }
      xmlBufferSetAllocationScheme(lVar9,0);
      xmlNodeDump(lVar9,pxVar7->doc,pxVar7,0);
      uVar8 = xmlBufferContent(lVar9);
      uVar3 = xmlBufferLength(lVar9);
      uVar8 = xmlRelaxNGNewMemParserCtxt(uVar8,uVar3);
      xmlRelaxNGSetParserErrors(uVar8,testErrorHandler,testErrorHandler,uVar8);
      xmlRelaxNGSetResourceLoader(uVar8,testResourceLoader,0);
      lVar10 = xmlRelaxNGParse(uVar8);
      xmlRelaxNGFreeParserCtxt(uVar8);
      if (lVar10 == 0) {
        uVar8 = xmlGetLineNo(pxVar7);
        test_log("Failed to parse RNGtest line %ld\n",uVar8);
        nb_errors = nb_errors + 1;
        memt = 1;
      }
      else {
        for (cur = getNext(pxVar6,"following-sibling::valid[1]"); cur != (xmlNodePtr)0x0;
            cur = getNext(cur,"following-sibling::valid[1]")) {
          lVar11 = xmlGetProp(cur,"dtd");
          pxVar7 = getNext(cur,"./*");
          pFVar1 = _stderr;
          if (pxVar7 == (xmlNodePtr)0x0) {
            uVar8 = xmlGetLineNo(cur);
            fprintf(pFVar1,"Failed to find test in <valid> line %ld\n",uVar8);
          }
          else {
            xmlBufferEmpty(lVar9);
            if (lVar11 != 0) {
              xmlBufferAdd(lVar9,lVar11,0xffffffff);
            }
            xmlNodeDump(lVar9,pxVar7->doc,pxVar7,0);
            iVar5 = xmlMemUsed();
            uVar8 = xmlBufferContent(lVar9);
            uVar3 = xmlBufferLength(lVar9);
            lVar12 = xmlReadMemory(uVar8,uVar3,"test",0);
            if (lVar12 == 0) {
              uVar8 = xmlGetLineNo(cur);
              test_log("Failed to parse valid instance line %ld\n",uVar8);
              nb_errors = nb_errors + 1;
            }
            else {
              nb_tests = nb_tests + 1;
              uVar8 = xmlRelaxNGNewValidCtxt(lVar10);
              xmlRelaxNGSetValidErrors(uVar8,testErrorHandler,testErrorHandler,uVar8);
              memt = xmlRelaxNGValidateDoc(uVar8,lVar12);
              xmlRelaxNGFreeValidCtxt(uVar8);
              if (memt < 1) {
                if (memt < 0) {
                  uVar8 = xmlGetLineNo(cur);
                  test_log("Internal error validating instance line %ld\n",uVar8);
                  nb_errors = nb_errors + 1;
                }
              }
              else {
                uVar8 = xmlGetLineNo(cur);
                test_log("Failed to validate valid instance line %ld\n",uVar8);
                nb_errors = nb_errors + 1;
              }
              xmlFreeDoc(lVar12);
            }
            xmlResetLastError();
            iVar4 = xmlMemUsed();
            if (iVar5 != iVar4) {
              uVar8 = xmlGetLineNo(cur);
              iVar4 = xmlMemUsed();
              test_log("Validation of instance line %ld leaked %d\n",uVar8,
                       (ulong)(uint)(iVar4 - iVar5));
              nb_leaks = nb_leaks + 1;
            }
          }
          if (lVar11 != 0) {
            (*_xmlFree)(lVar11);
          }
        }
        for (cur = getNext(pxVar6,"following-sibling::invalid[1]"); cur != (xmlNodePtr)0x0;
            cur = getNext(cur,"following-sibling::invalid[1]")) {
          pxVar7 = getNext(cur,"./*");
          pFVar1 = _stderr;
          if (pxVar7 == (xmlNodePtr)0x0) {
            uVar8 = xmlGetLineNo(cur);
            fprintf(pFVar1,"Failed to find test in <invalid> line %ld\n",uVar8);
          }
          else {
            xmlBufferEmpty(lVar9);
            xmlNodeDump(lVar9,pxVar7->doc,pxVar7,0);
            iVar5 = xmlMemUsed();
            uVar8 = xmlBufferContent(lVar9);
            uVar3 = xmlBufferLength(lVar9);
            lVar11 = xmlReadMemory(uVar8,uVar3,"test",0);
            if (lVar11 == 0) {
              uVar8 = xmlGetLineNo(cur);
              test_log("Failed to parse valid instance line %ld\n",uVar8);
              nb_errors = nb_errors + 1;
            }
            else {
              nb_tests = nb_tests + 1;
              uVar8 = xmlRelaxNGNewValidCtxt(lVar10);
              xmlRelaxNGSetValidErrors(uVar8,testErrorHandler,testErrorHandler,uVar8);
              memt = xmlRelaxNGValidateDoc(uVar8,lVar11);
              xmlRelaxNGFreeValidCtxt(uVar8);
              if (memt == 0) {
                uVar8 = xmlGetLineNo(cur);
                test_log("Failed to detect invalid instance line %ld\n",uVar8);
                nb_errors = nb_errors + 1;
              }
              else if (memt < 0) {
                uVar8 = xmlGetLineNo(cur);
                test_log("Internal error validating instance line %ld\n",uVar8);
                nb_errors = nb_errors + 1;
              }
              xmlFreeDoc(lVar11);
            }
            xmlResetLastError();
            iVar4 = xmlMemUsed();
            if (iVar5 != iVar4) {
              uVar8 = xmlGetLineNo(cur);
              iVar4 = xmlMemUsed();
              test_log("Validation of instance line %ld leaked %d\n",uVar8,
                       (ulong)(uint)(iVar4 - iVar5));
              nb_leaks = nb_leaks + 1;
            }
          }
        }
      }
      if (lVar9 != 0) {
        xmlBufferFree(lVar9);
      }
      if (lVar10 != 0) {
        xmlRelaxNGFree(lVar10);
      }
      xmlResetLastError();
      iVar5 = xmlMemUsed();
      if ((iVar2 != iVar5) && (iVar2 != 0)) {
        uVar8 = xmlGetLineNo(pxVar6);
        iVar5 = xmlMemUsed();
        test_log("Validation of tests starting line %ld leaked %d\n",uVar8,
                 (ulong)(uint)(iVar5 - iVar2));
        nb_leaks = nb_leaks + 1;
      }
      tst_local._4_4_ = memt;
    }
  }
  return tst_local._4_4_;
}

Assistant:

static int
xsdTestCase(xmlNodePtr tst) {
    xmlNodePtr test, tmp, cur;
    xmlBufferPtr buf;
    xmlDocPtr doc = NULL;
    xmlRelaxNGParserCtxtPtr pctxt;
    xmlRelaxNGValidCtxtPtr ctxt;
    xmlRelaxNGPtr rng = NULL;
    int ret = 0, mem, memt;
    xmlChar *dtd;

    resetEntities();
    testErrorsSize = 0; testErrors[0] = 0;

    tmp = getNext(tst, "./dir[1]");
    if (tmp != NULL) {
        installDirs(tmp, NULL);
    }
    tmp = getNext(tst, "./resource[1]");
    if (tmp != NULL) {
        installResources(tmp, NULL);
    }

    cur = getNext(tst, "./correct[1]");
    if (cur == NULL) {
        return(xsdIncorrectTestCase(tst));
    }

    test = getNext(cur, "./*");
    if (test == NULL) {
        fprintf(stderr, "Failed to find test in correct line %ld\n",
	        xmlGetLineNo(cur));
        return(1);
    }

    memt = xmlMemUsed();
    /*
     * dump the schemas to a buffer, then reparse it and compile the schemas
     */
    buf = xmlBufferCreate();
    if (buf == NULL) {
        fprintf(stderr, "out of memory !\n");
	fatalError();
    }
    xmlBufferSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);
    xmlNodeDump(buf, test->doc, test, 0, 0);
    pctxt = xmlRelaxNGNewMemParserCtxt(
            (const char *) xmlBufferContent(buf), xmlBufferLength(buf));
    xmlRelaxNGSetParserErrors(pctxt, testErrorHandler, testErrorHandler,
            pctxt);
    xmlRelaxNGSetResourceLoader(pctxt, testResourceLoader, NULL);
    rng = xmlRelaxNGParse(pctxt);
    xmlRelaxNGFreeParserCtxt(pctxt);

    if (rng == NULL) {
        test_log("Failed to parse RNGtest line %ld\n",
	        xmlGetLineNo(test));
	nb_errors++;
        ret = 1;
	goto done;
    }
    /*
     * now scan all the siblings of correct to process the <valid> tests
     */
    tmp = getNext(cur, "following-sibling::valid[1]");
    while (tmp != NULL) {
	dtd = xmlGetProp(tmp, BAD_CAST "dtd");
	test = getNext(tmp, "./*");
	if (test == NULL) {
	    fprintf(stderr, "Failed to find test in <valid> line %ld\n",
		    xmlGetLineNo(tmp));

	} else {
	    xmlBufferEmpty(buf);
	    if (dtd != NULL)
		xmlBufferAdd(buf, dtd, -1);
	    xmlNodeDump(buf, test->doc, test, 0, 0);

	    /*
	     * We are ready to run the test
	     */
	    mem = xmlMemUsed();
            doc = xmlReadMemory((const char *) xmlBufferContent(buf),
                                xmlBufferLength(buf), "test", NULL, 0);
	    if (doc == NULL) {
		test_log("Failed to parse valid instance line %ld\n",
			xmlGetLineNo(tmp));
		nb_errors++;
	    } else {
		nb_tests++;
	        ctxt = xmlRelaxNGNewValidCtxt(rng);
		xmlRelaxNGSetValidErrors(ctxt,
                        testErrorHandler, testErrorHandler, ctxt);
		ret = xmlRelaxNGValidateDoc(ctxt, doc);
		xmlRelaxNGFreeValidCtxt(ctxt);
		if (ret > 0) {
		    test_log("Failed to validate valid instance line %ld\n",
				xmlGetLineNo(tmp));
		    nb_errors++;
		} else if (ret < 0) {
		    test_log("Internal error validating instance line %ld\n",
			    xmlGetLineNo(tmp));
		    nb_errors++;
		}
		xmlFreeDoc(doc);
	    }
	    xmlResetLastError();
	    if (mem != xmlMemUsed()) {
	        test_log("Validation of instance line %ld leaked %d\n",
		        xmlGetLineNo(tmp), xmlMemUsed() - mem);
	        nb_leaks++;
	    }
	}
	if (dtd != NULL)
	    xmlFree(dtd);
	tmp = getNext(tmp, "following-sibling::valid[1]");
    }
    /*
     * now scan all the siblings of correct to process the <invalid> tests
     */
    tmp = getNext(cur, "following-sibling::invalid[1]");
    while (tmp != NULL) {
	test = getNext(tmp, "./*");
	if (test == NULL) {
	    fprintf(stderr, "Failed to find test in <invalid> line %ld\n",
		    xmlGetLineNo(tmp));

	} else {
	    xmlBufferEmpty(buf);
	    xmlNodeDump(buf, test->doc, test, 0, 0);

	    /*
	     * We are ready to run the test
	     */
	    mem = xmlMemUsed();
            doc = xmlReadMemory((const char *) xmlBufferContent(buf),
                                xmlBufferLength(buf), "test", NULL, 0);
	    if (doc == NULL) {
		test_log("Failed to parse valid instance line %ld\n",
			xmlGetLineNo(tmp));
		nb_errors++;
	    } else {
		nb_tests++;
	        ctxt = xmlRelaxNGNewValidCtxt(rng);
		xmlRelaxNGSetValidErrors(ctxt,
                        testErrorHandler, testErrorHandler, ctxt);
		ret = xmlRelaxNGValidateDoc(ctxt, doc);
		xmlRelaxNGFreeValidCtxt(ctxt);
		if (ret == 0) {
		    test_log("Failed to detect invalid instance line %ld\n",
				xmlGetLineNo(tmp));
		    nb_errors++;
		} else if (ret < 0) {
		    test_log("Internal error validating instance line %ld\n",
			    xmlGetLineNo(tmp));
		    nb_errors++;
		}
		xmlFreeDoc(doc);
	    }
	    xmlResetLastError();
	    if (mem != xmlMemUsed()) {
	        test_log("Validation of instance line %ld leaked %d\n",
		        xmlGetLineNo(tmp), xmlMemUsed() - mem);
	        nb_leaks++;
	    }
	}
	tmp = getNext(tmp, "following-sibling::invalid[1]");
    }

done:
    if (buf != NULL)
	xmlBufferFree(buf);
    if (rng != NULL)
        xmlRelaxNGFree(rng);
    xmlResetLastError();
    if ((memt != xmlMemUsed()) && (memt != 0)) {
	test_log("Validation of tests starting line %ld leaked %d\n",
		xmlGetLineNo(cur), xmlMemUsed() - memt);
	nb_leaks++;
    }
    return(ret);
}